

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

void __thiscall
spv::Builder::nextSwitchSegment
          (Builder *this,vector<spv::Block_*,_std::allocator<spv::Block_*>_> *segmentBlock,
          int nextSegment)

{
  Block *block;
  bool bVar1;
  
  if (0 < nextSegment) {
    bVar1 = Block::isTerminated(this->buildPoint);
    if (!bVar1) {
      createBranch(this,true,
                   (segmentBlock->super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>).
                   _M_impl.super__Vector_impl_data._M_start[(uint)nextSegment]);
    }
  }
  block = (segmentBlock->super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>)._M_impl.
          super__Vector_impl_data._M_start[nextSegment];
  spv::Function::addBlock(block->parent,block);
  this->buildPoint = block;
  this->dirtyLineTracker = true;
  this->dirtyScopeTracker = true;
  return;
}

Assistant:

void Builder::nextSwitchSegment(std::vector<Block*>& segmentBlock, int nextSegment)
{
    int lastSegment = nextSegment - 1;
    if (lastSegment >= 0) {
        // Close out previous segment by jumping, if necessary, to next segment
        if (! buildPoint->isTerminated())
            createBranch(true, segmentBlock[nextSegment]);
    }
    Block* block = segmentBlock[nextSegment];
    block->getParent().addBlock(block);
    setBuildPoint(block);
}